

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::ES5ArrayTypeHandlerBase
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,Recycler *recycler,
          DictionaryTypeHandlerBase<unsigned_short> *typeHandler)

{
  Recycler *alloc;
  IndexPropertyDescriptorMap *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  DictionaryTypeHandlerBase<unsigned_short>::DictionaryTypeHandlerBase
            (&this->super_DictionaryTypeHandlerBase<unsigned_short>,typeHandler);
  (this->super_DictionaryTypeHandlerBase<unsigned_short>).super_DynamicTypeHandler.
  _vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01550b50;
  (this->indexPropertyMap).ptr = (IndexPropertyDescriptorMap *)0x0;
  this->dataItemAttributes = '\a';
  this->lengthWritable = true;
  local_50 = (undefined1  [8])&IndexPropertyDescriptorMap::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9b91433;
  data.filename._0_4_ = 0xed;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_50);
  this_00 = (IndexPropertyDescriptorMap *)new<Memory::Recycler>(0x20,alloc,0x38bbb2);
  IndexPropertyDescriptorMap::IndexPropertyDescriptorMap(this_00,recycler);
  Memory::Recycler::WBSetBit((char *)&this->indexPropertyMap);
  (this->indexPropertyMap).ptr = this_00;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->indexPropertyMap);
  return;
}

Assistant:

ES5ArrayTypeHandlerBase<T>::ES5ArrayTypeHandlerBase(Recycler* recycler, DictionaryTypeHandlerBase<T>* typeHandler)
        : DictionaryTypeHandlerBase<T>(typeHandler), dataItemAttributes(PropertyDynamicTypeDefaults), lengthWritable(true)
    {
        indexPropertyMap = RecyclerNew(recycler, IndexPropertyDescriptorMap, recycler);
    }